

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[24],char_const*,char[7],char_const*,char[18],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [24],char **Args_1,
          char (*Args_2) [7],char **Args_3,char (*Args_4) [18],unsigned_long *Args_5,
          char (*Args_6) [2],unsigned_long *Args_7,char (*Args_8) [30],unsigned_long *Args_9,
          char (*Args_10) [2])

{
  stringstream local_1e0 [8];
  stringstream ss;
  char (*Args_local_4) [18];
  char **Args_local_3;
  char (*Args_local_2) [7];
  char **Args_local_1;
  char (*Args_local) [24];
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  FormatStrSS<std::__cxx11::stringstream,char[24],char_const*,char[7],char_const*,char[18],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (char (*) [24])this,(char **)Args,(char (*) [7])Args_1,(char **)Args_2,
             (char (*) [18])Args_3,(unsigned_long *)Args_4,(char (*) [2])Args_5,
             (unsigned_long *)Args_6,(char (*) [30])Args_7,(unsigned_long *)Args_8,
             (char (*) [2])Args_9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}